

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O2

void Wln_WriteVerIntVec(FILE *pFile,Wln_Ntk_t *p,Vec_Int_t *vVec,int Start)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  int i;
  int iVar4;
  int iVar5;
  
  iVar5 = 0;
  iVar4 = Start;
  for (i = 0; i < vVec->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vVec,i);
    __s = Wln_ObjName(p,iVar1);
    sVar2 = strlen(__s);
    iVar1 = (int)sVar2 + 2;
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else if (0x43 < iVar1 + iVar4) {
      fwrite("\n   ",4,1,(FILE *)pFile);
      iVar5 = 0;
      iVar4 = Start;
    }
    pcVar3 = ",";
    if (i == vVec->nSize + -1) {
      pcVar3 = "";
    }
    fprintf((FILE *)pFile," %s%s",__s,pcVar3);
    iVar4 = iVar4 + iVar1;
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void Wln_WriteVerIntVec( FILE * pFile, Wln_Ntk_t * p, Vec_Int_t * vVec, int Start )
{
    char * pName;
    int LineLength  = Start;
    int NameCounter = 0;
    int AddedLength, i, iObj;
    Vec_IntForEachEntry( vVec, iObj, i )
    {
        pName = Wln_ObjName( p, iObj );
        // get the line length after this name is written
        AddedLength = strlen(pName) + 2;
        if ( NameCounter && LineLength + AddedLength + 3 > 70 )
        { // write the line extender
            fprintf( pFile, "\n   " );
            // reset the line length
            LineLength  = Start;
            NameCounter = 0;
        }
        fprintf( pFile, " %s%s", pName, (i==Vec_IntSize(vVec)-1)? "" : "," );
        LineLength += AddedLength;
        NameCounter++;
    }
}